

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O3

void DISTRHO::fillInPredefinedPortGroupData(uint32_t groupId,PortGroup *portGroup)

{
  int __fd;
  
  if (groupId == 0xfffffffd) {
    String::_dup(&portGroup->name,0x110910);
    __fd = 0x110917;
  }
  else {
    if (groupId != 0xfffffffe) {
      if (groupId == 0xffffffff) {
        if ((portGroup->name).fBufferLen != 0) {
          *(portGroup->name).fBuffer = '\0';
          (portGroup->name).fBufferLen = 0;
        }
        if ((portGroup->symbol).fBufferLen != 0) {
          *(portGroup->symbol).fBuffer = '\0';
          (portGroup->symbol).fBufferLen = 0;
        }
      }
      return;
    }
    String::_dup(&portGroup->name,0x110902);
    __fd = 0x110907;
  }
  String::_dup(&portGroup->symbol,__fd);
  return;
}

Assistant:

static void fillInPredefinedPortGroupData(const uint32_t groupId, PortGroup& portGroup)
{
    switch (groupId)
    {
    case kPortGroupNone:
        portGroup.name.clear();
        portGroup.symbol.clear();
        break;
    case kPortGroupMono:
        portGroup.name = "Mono";
        portGroup.symbol = "dpf_mono";
        break;
    case kPortGroupStereo:
        portGroup.name = "Stereo";
        portGroup.symbol = "dpf_stereo";
        break;
    }
}